

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O1

int chirc_ctx_add_server(chirc_ctx_t *ctx,chirc_server_t *server)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  byte bVar3;
  byte *pbVar4;
  chirc_server_t *pcVar5;
  UT_hash_handle *pUVar6;
  UT_hash_bucket *pUVar7;
  UT_hash_handle *pUVar8;
  UT_hash_handle *pUVar9;
  UT_hash_table *pUVar10;
  UT_hash_bucket *pUVar11;
  byte *pbVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  size_t __size;
  uint uVar19;
  
  pbVar4 = (byte *)server->servername;
  bVar3 = pbVar4[-1];
  switch(bVar3 & 7) {
  case 0:
    uVar16 = (ulong)(bVar3 >> 3);
    break;
  case 1:
    uVar16 = (ulong)pbVar4[-3];
    break;
  case 2:
    uVar16 = (ulong)*(ushort *)(pbVar4 + -5);
    break;
  case 3:
    uVar16 = (ulong)*(uint *)(pbVar4 + -9);
    break;
  case 4:
    uVar16 = *(ulong *)(pbVar4 + -0x11);
    break;
  default:
    uVar16 = 0;
  }
  uVar17 = (uint)uVar16;
  pbVar12 = pbVar4;
  if (uVar17 < 0xc) {
    uVar13 = 0xfeedbeef;
    uVar15 = 0x9e3779b9;
    uVar14 = 0x9e3779b9;
  }
  else {
    uVar14 = 0x9e3779b9;
    uVar13 = 0xfeedbeef;
    uVar15 = 0x9e3779b9;
    do {
      uVar13 = uVar13 + *(int *)(pbVar12 + 8);
      uVar17 = uVar13 >> 0xd ^
               ((uVar14 + *(int *)pbVar12) - (uVar15 + *(int *)(pbVar12 + 4))) - uVar13;
      uVar15 = uVar17 << 8 ^ ((uVar15 + *(int *)(pbVar12 + 4)) - uVar13) - uVar17;
      uVar14 = uVar15 >> 0xd ^ (uVar13 - uVar17) - uVar15;
      uVar17 = uVar14 >> 0xc ^ (uVar17 - uVar15) - uVar14;
      uVar13 = uVar17 << 0x10 ^ (uVar15 - uVar14) - uVar17;
      uVar19 = uVar13 >> 5 ^ (uVar14 - uVar17) - uVar13;
      uVar14 = uVar19 >> 3 ^ (uVar17 - uVar13) - uVar19;
      uVar15 = uVar14 << 10 ^ (uVar13 - uVar19) - uVar14;
      uVar13 = uVar15 >> 0xf ^ (uVar19 - uVar14) - uVar15;
      pbVar12 = pbVar12 + 0xc;
      uVar17 = (int)uVar16 - 0xc;
      uVar16 = (ulong)uVar17;
    } while (0xb < uVar17);
  }
  switch(bVar3 & 7) {
  case 0:
    uVar19 = (uint)(bVar3 >> 3);
    break;
  case 1:
    uVar19 = (uint)pbVar4[-3];
    break;
  case 2:
    uVar19 = (uint)*(ushort *)(pbVar4 + -5);
    break;
  case 3:
    uVar19 = *(uint *)(pbVar4 + -9);
    break;
  case 4:
    uVar19 = (uint)*(undefined8 *)(pbVar4 + -0x11);
    break;
  default:
    uVar19 = 0;
  }
  uVar13 = uVar13 + uVar19;
  switch(uVar17) {
  case 9:
    uVar15 = (uint)pbVar12[4] +
             (uint)pbVar12[5] * 0x100 +
             (uint)pbVar12[6] * 0x10000 + (uint)pbVar12[7] * 0x1000000 + uVar15;
  case 5:
    uVar14 = (uint)*pbVar12 +
             (uint)pbVar12[1] * 0x100 +
             (uint)pbVar12[2] * 0x10000 + (uint)pbVar12[3] * 0x1000000 + uVar14;
  }
  uVar17 = uVar13 >> 0xd ^ (uVar14 - uVar15) - uVar13;
  uVar15 = uVar17 << 8 ^ (uVar15 - uVar13) - uVar17;
  uVar13 = uVar15 >> 0xd ^ (uVar13 - uVar17) - uVar15;
  uVar14 = uVar13 >> 0xc ^ (uVar17 - uVar15) - uVar13;
  uVar17 = uVar14 << 0x10 ^ (uVar15 - uVar13) - uVar14;
  uVar13 = uVar17 >> 5 ^ (uVar13 - uVar14) - uVar17;
  uVar14 = uVar13 >> 3 ^ (uVar14 - uVar17) - uVar13;
  uVar17 = uVar14 << 10 ^ (uVar17 - uVar13) - uVar14;
  uVar17 = uVar17 >> 0xf ^ uVar13 - (uVar14 + uVar17);
  (server->hh).hashv = uVar17;
  (server->hh).key = pbVar4;
  switch(pbVar4[-1] & 7) {
  case 0:
    uVar14 = (uint)(pbVar4[-1] >> 3);
    break;
  case 1:
    uVar14 = (uint)pbVar4[-3];
    break;
  case 2:
    uVar14 = (uint)*(ushort *)(pbVar4 + -5);
    break;
  case 3:
    uVar14 = *(uint *)(pbVar4 + -9);
    break;
  case 4:
    uVar14 = (uint)*(undefined8 *)(pbVar4 + -0x11);
    break;
  default:
    uVar14 = 0;
  }
  pUVar1 = &server->hh;
  (server->hh).keylen = uVar14;
  pcVar5 = (ctx->network).servers;
  if (pcVar5 == (chirc_server_t *)0x0) {
    pUVar10 = (UT_hash_table *)malloc(0x40);
    (server->hh).prev = (void *)0x0;
    (server->hh).next = (void *)0x0;
    (server->hh).tbl = pUVar10;
    if (pUVar10 == (UT_hash_table *)0x0) goto LAB_0010635b;
    *(undefined8 *)&pUVar10->num_items = 0;
    pUVar10->tail = (UT_hash_handle *)0x0;
    pUVar10->buckets = (UT_hash_bucket *)0x0;
    pUVar10->num_buckets = 0;
    pUVar10->log2_num_buckets = 0;
    pUVar10->hho = 0;
    pUVar10->ideal_chain_maxlen = 0;
    pUVar10->nonideal_items = 0;
    pUVar10->ineff_expands = 0;
    pUVar10->noexpand = 0;
    *(undefined8 *)&pUVar10->signature = 0;
    pUVar10->tail = pUVar1;
    pUVar10->num_buckets = 0x20;
    pUVar10->log2_num_buckets = 5;
    pUVar10->hho = 0x30;
    pUVar11 = (UT_hash_bucket *)malloc(0x200);
    pUVar10->buckets = pUVar11;
    pUVar10->signature = 0xa0111fe1;
    if (pUVar11 == (UT_hash_bucket *)0x0) goto LAB_0010635b;
    memset(pUVar11,0,0x200);
    (ctx->network).servers = server;
  }
  else {
    (server->hh).tbl = (pcVar5->hh).tbl;
    (server->hh).next = (void *)0x0;
    pUVar10 = (pcVar5->hh).tbl;
    pUVar6 = pUVar10->tail;
    (server->hh).prev = (void *)((long)pUVar6 - pUVar10->hho);
    pUVar6->next = server;
    pUVar10->tail = pUVar1;
  }
  pUVar10 = (((ctx->network).servers)->hh).tbl;
  pUVar10->num_items = pUVar10->num_items + 1;
  uVar17 = pUVar10->num_buckets - 1 & uVar17;
  pUVar11 = pUVar10->buckets;
  uVar14 = pUVar11[uVar17].count + 1;
  pUVar11[uVar17].count = uVar14;
  pUVar6 = pUVar11[uVar17].hh_head;
  (server->hh).hh_next = pUVar6;
  (server->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar6 != (UT_hash_handle *)0x0) {
    pUVar6->hh_prev = pUVar1;
  }
  pUVar11[uVar17].hh_head = pUVar1;
  if ((pUVar11[uVar17].expand_mult * 10 + 10 <= uVar14) &&
     (pUVar10 = pUVar1->tbl, pUVar10->noexpand == 0)) {
    __size = (ulong)pUVar10->num_buckets << 5;
    pUVar11 = (UT_hash_bucket *)malloc(__size);
    if (pUVar11 == (UT_hash_bucket *)0x0) {
LAB_0010635b:
      exit(-1);
    }
    uVar13 = 0;
    memset(pUVar11,0,__size);
    uVar17 = pUVar10->num_buckets;
    uVar15 = uVar17 * 2 - 1;
    uVar14 = ((pUVar10->num_items >> ((char)pUVar10->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar15 & pUVar10->num_items) == 0);
    pUVar10->ideal_chain_maxlen = uVar14;
    pUVar10->nonideal_items = 0;
    if ((ulong)uVar17 != 0) {
      pUVar7 = pUVar10->buckets;
      uVar16 = 0;
      do {
        pUVar6 = pUVar7[uVar16].hh_head;
        while (pUVar6 != (UT_hash_handle *)0x0) {
          pUVar8 = pUVar6->hh_next;
          uVar18 = pUVar6->hashv & uVar15;
          pUVar2 = pUVar11 + uVar18;
          uVar19 = pUVar11[uVar18].count + 1;
          pUVar11[uVar18].count = uVar19;
          if (uVar14 < uVar19) {
            pUVar10->nonideal_items = pUVar10->nonideal_items + 1;
            if (pUVar2->expand_mult * uVar14 < uVar19) {
              pUVar2->expand_mult = pUVar2->expand_mult + 1;
            }
          }
          pUVar6->hh_prev = (UT_hash_handle *)0x0;
          pUVar9 = pUVar2->hh_head;
          pUVar6->hh_next = pUVar9;
          if (pUVar9 != (UT_hash_handle *)0x0) {
            pUVar9->hh_prev = pUVar6;
          }
          pUVar2->hh_head = pUVar6;
          pUVar6 = pUVar8;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar17);
    }
    free(pUVar10->buckets);
    pUVar10 = pUVar1->tbl;
    pUVar10->num_buckets = pUVar10->num_buckets << 1;
    pUVar10->log2_num_buckets = pUVar10->log2_num_buckets + 1;
    pUVar10->buckets = pUVar11;
    if (pUVar10->num_items >> 1 < pUVar10->nonideal_items) {
      uVar13 = pUVar10->ineff_expands + 1;
    }
    pUVar10->ineff_expands = uVar13;
    if (1 < uVar13) {
      pUVar10->noexpand = 1;
    }
  }
  return 0;
}

Assistant:

int chirc_ctx_add_server(chirc_ctx_t *ctx, chirc_server_t *server)
{
    HASH_ADD_KEYPTR(hh, ctx->network.servers, server->servername, sdslen(server->servername), server);

    return CHIRC_OK;
}